

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_EnvironmentsImpl::operator==(ON_EnvironmentsImpl *this,ON_EnvironmentsImpl *ep)

{
  bool bVar1;
  bool bVar2;
  ON_UUID local_80;
  ON_UUID local_70;
  ON_UUID local_60;
  ON_UUID local_50;
  ON_UUID local_40;
  ON_UUID local_30;
  ON_EnvironmentsImpl *local_20;
  ON_EnvironmentsImpl *ep_local;
  ON_EnvironmentsImpl *this_local;
  
  local_20 = ep;
  ep_local = this;
  local_30 = BackgroundRenderEnvironmentId(this);
  local_40 = BackgroundRenderEnvironmentId(local_20);
  bVar1 = ::operator!=(&local_30,&local_40);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = SkylightingRenderEnvironmentOverride(this);
    bVar2 = SkylightingRenderEnvironmentOverride(local_20);
    if (bVar1 == bVar2) {
      local_50 = SkylightingRenderEnvironmentId(this);
      local_60 = SkylightingRenderEnvironmentId(local_20);
      bVar1 = ::operator!=(&local_50,&local_60);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = ReflectionRenderEnvironmentOverride(this);
        bVar2 = ReflectionRenderEnvironmentOverride(local_20);
        if (bVar1 == bVar2) {
          local_70 = ReflectionRenderEnvironmentId(this);
          local_80 = ReflectionRenderEnvironmentId(local_20);
          bVar1 = ::operator!=(&local_70,&local_80);
          if (bVar1) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_EnvironmentsImpl::operator == (const ON_EnvironmentsImpl& ep)
{
  if (BackgroundRenderEnvironmentId()        != ep.BackgroundRenderEnvironmentId())        return false;
  if (SkylightingRenderEnvironmentOverride() != ep.SkylightingRenderEnvironmentOverride()) return false;
  if (SkylightingRenderEnvironmentId()       != ep.SkylightingRenderEnvironmentId())       return false;
  if (ReflectionRenderEnvironmentOverride()  != ep.ReflectionRenderEnvironmentOverride())  return false;
  if (ReflectionRenderEnvironmentId()        != ep.ReflectionRenderEnvironmentId())        return false;

  return true;
}